

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBrCMem
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isHelper)

{
  undefined2 uVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  BranchInstr *pBVar7;
  HelperCallOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar8;
  BailOutInfo *pBVar9;
  OpCode OVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte local_7d;
  bool loadArg2;
  bool loadScriptContext;
  bool inverted;
  StackSym *symDst;
  Opnd *opndDst;
  Opnd *opndSrc;
  HelperCallOpnd *opndHelper;
  Instr *instrCall;
  Instr *instrPrev;
  bool isHelper_local;
  bool noMathFastPath_local;
  Instr *pIStack_20;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar2 = instr->m_prev;
  instrPrev._2_1_ = isHelper;
  instrPrev._3_1_ = noMathFastPath;
  instrPrev._4_4_ = helperMethod;
  pIStack_20 = instr;
  instr_local = (Instr *)this;
  pOVar5 = IR::Instr::GetSrc1(instr);
  if ((pOVar5 == (Opnd *)0x0) || (pOVar5 = IR::Instr::GetSrc2(pIStack_20), pOVar5 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x29e4,"(instr->GetSrc1() != nullptr && instr->GetSrc2() != nullptr)",
                       "Expected 2 src opnds on BrC");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((instrPrev._3_1_ & 1) == 0) {
    pBVar7 = IR::Instr::AsBranchInstr(pIStack_20);
    bVar4 = GenerateFastCondBranch(this,pBVar7,(bool *)((long)&instrPrev + 2));
    if (!bVar4) {
      return pIVar2;
    }
  }
  bVar4 = instrPrev._4_4_ != HelperOp_StrictEqualString;
  bVar11 = instrPrev._4_4_ != HelperOp_StrictEqualEmptyString;
  bVar12 = instrPrev._4_4_ != HelperOp_StrictEqualEmptyString;
  if (instrPrev._4_4_ == HelperOp_NotEqual) {
    instrPrev._4_4_ = HelperOp_Equal;
    pBVar7 = IR::Instr::AsBranchInstr(pIStack_20);
    IR::BranchInstr::Invert(pBVar7);
    bVar13 = true;
  }
  else {
    bVar13 = instrPrev._4_4_ == HelperOp_NotStrictEqual;
    if (bVar13) {
      instrPrev._4_4_ = HelperOp_StrictEqual;
      pBVar7 = IR::Instr::AsBranchInstr(pIStack_20);
      IR::BranchInstr::Invert(pBVar7);
    }
  }
  if (bVar4 && bVar11) {
    LoadScriptContext(this,pIStack_20);
  }
  pOVar5 = IR::Instr::UnlinkSrc2(pIStack_20);
  if (bVar12) {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_20,pOVar5);
  }
  pOVar5 = IR::Instr::UnlinkSrc1(pIStack_20);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_20,pOVar5);
  src1Opnd = IR::HelperCallOpnd::New(instrPrev._4_4_,this->m_func);
  sym = StackSym::New(TyInt64,this->m_func);
  dstOpnd = IR::RegOpnd::New(sym,TyInt64,this->m_func);
  pIVar8 = IR::Instr::New(Call,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(pIStack_20,pIVar8);
  pIVar8 = LowererMD::LowerCall(&this->m_lowererMD,pIVar8,0);
  uVar1 = pIStack_20->m_opcode;
  if ((ushort)(uVar1 - 0x194) < 4) {
    bVar4 = IR::Instr::HasBailOutInfo(pIStack_20);
    if (bVar4) {
      pBVar9 = IR::Instr::GetBailOutInfo(pIStack_20);
      pBVar9->isInvertedBranch = true;
    }
  }
  else if ((ushort)(uVar1 - 0x198) < 4) {
    bVar13 = true;
  }
  IR::Instr::SetSrc1(pIStack_20,&dstOpnd->super_Opnd);
  OVar10 = BrTrue_A;
  if (bVar13) {
    OVar10 = BrFalse_A;
  }
  pIStack_20->m_opcode = OVar10;
  pBVar7 = IR::Instr::AsBranchInstr(pIStack_20);
  local_7d = 0;
  if ((instrPrev._3_1_ & 1) == 0) {
    local_7d = instrPrev._2_1_;
  }
  LowerCondBranchCheckBailOut(this,pBVar7,pIVar8,(bool)(local_7d & 1));
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerBrCMem(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndSrc;
    IR::Opnd  * opndDst;
    StackSym * symDst;
    bool inverted = false;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() != nullptr, "Expected 2 src opnds on BrC");

    if (!noMathFastPath && !this->GenerateFastCondBranch(instr->AsBranchInstr(), &isHelper))
    {
        return instrPrev;
    }

    // Push the args in reverse order.
    const bool loadScriptContext = !(helperMethod == IR::HelperOp_StrictEqualString || helperMethod == IR::HelperOp_StrictEqualEmptyString);
    const bool loadArg2 = !(helperMethod == IR::HelperOp_StrictEqualEmptyString);

    if (helperMethod == IR::HelperOp_NotEqual)
    {
        // Op_NotEqual() returns !Op_Equal().  It is faster to call Op_Equal() directly.
        helperMethod = IR::HelperOp_Equal;
        instr->AsBranchInstr()->Invert();
        inverted = true;
    }
    else if(helperMethod == IR::HelperOp_NotStrictEqual)
    {
        // Op_NotStrictEqual() returns !Op_StrictEqual().  It is faster to call Op_StrictEqual() directly.
        helperMethod = IR::HelperOp_StrictEqual;
        instr->AsBranchInstr()->Invert();
        inverted = true;
    }

    if (loadScriptContext)
        LoadScriptContext(instr);

    opndSrc = instr->UnlinkSrc2();
    if (loadArg2)
        m_lowererMD.LoadHelperArgument(instr, opndSrc);

    opndSrc = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, opndSrc);

    // Generate helper call to compare the source operands.

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);
    symDst = StackSym::New(TyMachReg, this->m_func);
    opndDst = IR::RegOpnd::New(symDst, TyMachReg, this->m_func);
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (instr->HasBailOutInfo())
        {
            instr->GetBailOutInfo()->isInvertedBranch = true;
        }
        break;

    case Js::OpCode::BrNotGe_A:
    case Js::OpCode::BrNotGt_A:
    case Js::OpCode::BrNotLe_A:
    case Js::OpCode::BrNotLt_A:
        inverted = true;
        break;
    }

    // Branch if the result is "true".

    instr->SetSrc1(opndDst);
    instr->m_opcode = (inverted ? Js::OpCode::BrFalse_A : Js::OpCode::BrTrue_A);
    this->LowerCondBranchCheckBailOut(instr->AsBranchInstr(), instrCall, !noMathFastPath && isHelper);

    return instrPrev;
}